

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O0

bool Assimp::SkipLine<char>(char *in,char **out)

{
  bool bVar1;
  char **out_local;
  char *in_local;
  
  out_local = (char **)in;
  while( true ) {
    bVar1 = false;
    if ((*(char *)out_local != '\r') && (bVar1 = false, *(char *)out_local != '\n')) {
      bVar1 = *(char *)out_local != '\0';
    }
    if (!bVar1) break;
    out_local = (char **)((long)out_local + 1);
  }
  while( true ) {
    bVar1 = true;
    if (*(char *)out_local != '\r') {
      bVar1 = *(char *)out_local == '\n';
    }
    if (!bVar1) break;
    out_local = (char **)((long)out_local + 1);
  }
  *out = (char *)out_local;
  return *(char *)out_local != '\0';
}

Assistant:

AI_FORCE_INLINE
bool SkipLine( const char_t* in, const char_t** out) {
    while( *in != ( char_t )'\r' && *in != ( char_t )'\n' && *in != ( char_t )'\0' ) {
        ++in;
    }

    // files are opened in binary mode. Ergo there are both NL and CR
    while( *in == ( char_t )'\r' || *in == ( char_t )'\n' ) {
        ++in;
    }
    *out = in;
    return *in != (char_t)'\0';
}